

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O3

int run_test_tty(void)

{
  uint uVar1;
  int iVar2;
  uv_handle_type uVar3;
  int iVar4;
  int extraout_EAX;
  uv_loop_t *loop;
  int *piVar5;
  uv_loop_t *loop_00;
  uv_handle_t *handle;
  int64_t eval_b_5;
  int64_t eval_b_6;
  int height;
  int width;
  uv_tty_t tty_out;
  uv_tty_t tty_in;
  undefined1 auStack_e78 [32];
  uv_tty_t uStack_e58;
  uv_tty_t uStack_d40;
  uv_loop_t uStack_c28;
  uv_loop_t *puStack_900;
  code *pcStack_8f8;
  long lStack_8f0;
  long lStack_8e8;
  undefined1 auStack_8e0 [280];
  undefined1 auStack_7c8 [280];
  undefined1 auStack_6b0 [1088];
  uv_loop_t *puStack_270;
  long local_260;
  long local_258;
  uint local_250;
  uint local_24c;
  uv_tty_t local_248;
  uv_tty_t local_130;
  
  puStack_270 = (uv_loop_t *)0x1d4b2c;
  loop = uv_default_loop();
  puStack_270 = (uv_loop_t *)0x1d4b41;
  uVar1 = open64("/dev/tty",0,0);
  if ((int)uVar1 < 0) {
    puStack_270 = (uv_loop_t *)0x1d4f74;
    run_test_tty_cold_24();
    return 7;
  }
  piVar5 = (int *)(ulong)uVar1;
  puStack_270 = (uv_loop_t *)0x1d4b61;
  iVar2 = open64("/dev/tty",1,0);
  if (iVar2 < 0) {
    puStack_270 = (uv_loop_t *)0x1d4f7e;
    run_test_tty_cold_23();
    return 7;
  }
  local_248.data = (void *)0x0;
  local_130.data = (void *)0x0;
  puStack_270 = (uv_loop_t *)0x1d4bce;
  uVar3 = uv_guess_handle(-1);
  local_248.data = (void *)(ulong)uVar3;
  if (local_130.data == local_248.data) {
    local_130.data = (void *)0xe;
    puStack_270 = (uv_loop_t *)0x1d4bfc;
    uVar3 = uv_guess_handle(uVar1);
    local_248.data = (void *)(ulong)uVar3;
    if (local_130.data != local_248.data) goto LAB_001d4fb9;
    local_130.data = (void *)0xe;
    puStack_270 = (uv_loop_t *)0x1d4c29;
    uVar3 = uv_guess_handle(iVar2);
    local_248.data = (void *)(ulong)uVar3;
    if (local_130.data != local_248.data) goto LAB_001d4fcb;
    puStack_270 = (uv_loop_t *)0x1d4c5b;
    iVar4 = uv_tty_init(loop,&local_130,uVar1,1);
    local_248.data = (void *)(long)iVar4;
    local_260 = 0;
    if (local_248.data != (void *)0x0) goto LAB_001d4fdd;
    puStack_270 = (uv_loop_t *)0x1d4c88;
    iVar4 = uv_is_readable((uv_stream_t *)&local_130);
    if (iVar4 == 0) goto LAB_001d4fec;
    puStack_270 = (uv_loop_t *)0x1d4c9d;
    iVar4 = uv_is_writable((uv_stream_t *)&local_130);
    if (iVar4 != 0) goto LAB_001d4ff1;
    puStack_270 = (uv_loop_t *)0x1d4cb6;
    iVar2 = uv_tty_init(loop,&local_248,iVar2,0);
    local_260 = (long)iVar2;
    local_258 = 0;
    if (local_260 != 0) goto LAB_001d4ff6;
    puStack_270 = (uv_loop_t *)0x1d4ce0;
    iVar2 = uv_is_readable((uv_stream_t *)&local_248);
    if (iVar2 != 0) goto LAB_001d5005;
    puStack_270 = (uv_loop_t *)0x1d4cf2;
    iVar2 = uv_is_writable((uv_stream_t *)&local_248);
    if (iVar2 == 0) goto LAB_001d500a;
    puStack_270 = (uv_loop_t *)0x1d4d0e;
    iVar2 = uv_tty_get_winsize(&local_248,(int *)&local_24c,(int *)&local_250);
    local_260 = (long)iVar2;
    local_258 = 0;
    if (local_260 != 0) goto LAB_001d500f;
    puStack_270 = (uv_loop_t *)0x1d4d44;
    printf("width=%d height=%d\n",(ulong)local_24c,(ulong)local_250);
    if (local_24c == 0 && local_250 == 0) {
      puStack_270 = (uv_loop_t *)0x1d4d64;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      puStack_270 = (uv_loop_t *)0x1d4d6e;
      uv_run(loop,UV_RUN_DEFAULT);
      local_260 = 0;
      puStack_270 = (uv_loop_t *)0x1d4d7f;
      iVar2 = uv_loop_close(loop);
      local_258 = (long)iVar2;
      if (local_260 == local_258) {
        puStack_270 = (uv_loop_t *)0x1d4d9b;
        uv_library_shutdown();
        return 7;
      }
      goto LAB_001d501e;
    }
    local_258 = 0;
    local_260 = (long)(int)local_24c;
    if ((long)(int)local_24c < 1) goto LAB_001d502d;
    local_260 = (long)(int)local_250;
    local_258 = 0;
    if (local_260 < 1) goto LAB_001d503c;
    puStack_270 = (uv_loop_t *)0x1d4df6;
    iVar2 = uv_tty_set_mode(&local_130,UV_TTY_MODE_RAW);
    local_260 = (long)iVar2;
    local_258 = 0;
    if (local_260 != 0) goto LAB_001d504b;
    puStack_270 = (uv_loop_t *)0x1d4e25;
    iVar2 = uv_tty_set_mode(&local_130,UV_TTY_MODE_NORMAL);
    local_260 = (long)iVar2;
    local_258 = 0;
    if (local_260 != 0) goto LAB_001d505a;
    puStack_270 = (uv_loop_t *)0x1d4e4a;
    piVar5 = __errno_location();
    *piVar5 = 0;
    puStack_270 = (uv_loop_t *)0x1d4e58;
    iVar2 = uv_tty_reset_mode();
    local_260 = (long)iVar2;
    local_258 = 0;
    if (local_260 != 0) goto LAB_001d5069;
    puStack_270 = (uv_loop_t *)0x1d4e7d;
    iVar2 = uv_tty_reset_mode();
    local_260 = (long)iVar2;
    local_258 = 0;
    if (local_260 != 0) goto LAB_001d5078;
    puStack_270 = (uv_loop_t *)0x1d4ea2;
    iVar2 = uv_tty_reset_mode();
    local_260 = (long)iVar2;
    local_258 = 0;
    if (local_260 != 0) goto LAB_001d5087;
    local_260 = (long)*piVar5;
    local_258 = 0;
    if (local_260 != 0) goto LAB_001d5096;
    piVar5 = (int *)0x0;
    puStack_270 = (uv_loop_t *)0x1d4ef5;
    uv_close((uv_handle_t *)&local_130,(uv_close_cb)0x0);
    puStack_270 = (uv_loop_t *)0x1d4f01;
    uv_close((uv_handle_t *)&local_248,(uv_close_cb)0x0);
    puStack_270 = (uv_loop_t *)0x1d4f0b;
    uv_run(loop,UV_RUN_DEFAULT);
    puStack_270 = (uv_loop_t *)0x1d4f10;
    loop = uv_default_loop();
    puStack_270 = (uv_loop_t *)0x1d4f24;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    puStack_270 = (uv_loop_t *)0x1d4f2e;
    uv_run(loop,UV_RUN_DEFAULT);
    local_260 = 0;
    puStack_270 = (uv_loop_t *)0x1d4f3c;
    loop_00 = uv_default_loop();
    puStack_270 = (uv_loop_t *)0x1d4f44;
    iVar2 = uv_loop_close(loop_00);
    local_258 = (long)iVar2;
    if (local_260 == local_258) {
      puStack_270 = (uv_loop_t *)0x1d4f60;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_270 = (uv_loop_t *)0x1d4fb9;
    run_test_tty_cold_1();
LAB_001d4fb9:
    puStack_270 = (uv_loop_t *)0x1d4fcb;
    run_test_tty_cold_2();
LAB_001d4fcb:
    puStack_270 = (uv_loop_t *)0x1d4fdd;
    run_test_tty_cold_3();
LAB_001d4fdd:
    puStack_270 = (uv_loop_t *)0x1d4fec;
    run_test_tty_cold_4();
LAB_001d4fec:
    puStack_270 = (uv_loop_t *)0x1d4ff1;
    run_test_tty_cold_20();
LAB_001d4ff1:
    puStack_270 = (uv_loop_t *)0x1d4ff6;
    run_test_tty_cold_5();
LAB_001d4ff6:
    puStack_270 = (uv_loop_t *)0x1d5005;
    run_test_tty_cold_6();
LAB_001d5005:
    puStack_270 = (uv_loop_t *)0x1d500a;
    run_test_tty_cold_7();
LAB_001d500a:
    puStack_270 = (uv_loop_t *)0x1d500f;
    run_test_tty_cold_19();
LAB_001d500f:
    puStack_270 = (uv_loop_t *)0x1d501e;
    run_test_tty_cold_8();
LAB_001d501e:
    puStack_270 = (uv_loop_t *)0x1d502d;
    run_test_tty_cold_18();
LAB_001d502d:
    puStack_270 = (uv_loop_t *)0x1d503c;
    run_test_tty_cold_9();
LAB_001d503c:
    puStack_270 = (uv_loop_t *)0x1d504b;
    run_test_tty_cold_10();
LAB_001d504b:
    puStack_270 = (uv_loop_t *)0x1d505a;
    run_test_tty_cold_11();
LAB_001d505a:
    puStack_270 = (uv_loop_t *)0x1d5069;
    run_test_tty_cold_12();
LAB_001d5069:
    puStack_270 = (uv_loop_t *)0x1d5078;
    run_test_tty_cold_13();
LAB_001d5078:
    puStack_270 = (uv_loop_t *)0x1d5087;
    run_test_tty_cold_14();
LAB_001d5087:
    puStack_270 = (uv_loop_t *)0x1d5096;
    run_test_tty_cold_15();
LAB_001d5096:
    puStack_270 = (uv_loop_t *)0x1d50a5;
    run_test_tty_cold_16();
  }
  puStack_270 = (uv_loop_t *)run_test_tty_file;
  run_test_tty_cold_17();
  pcStack_8f8 = (code *)0x1d50c9;
  puStack_270 = loop;
  iVar2 = uv_loop_init((uv_loop_t *)(auStack_6b0 + 0x118));
  auStack_6b0._0_8_ = SEXT48(iVar2);
  auStack_7c8._0_8_ = (uv__queue *)0x0;
  if ((uv__queue *)auStack_6b0._0_8_ == (uv__queue *)0x0) {
    pcStack_8f8 = (code *)0x1d5105;
    uVar1 = open64("test/fixtures/empty_file",0);
    if (uVar1 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar1;
      auStack_7c8._0_8_ = (uv__queue *)0xffffffffffffffea;
      pcStack_8f8 = (code *)0x1d5138;
      iVar2 = uv_tty_init((uv_loop_t *)(auStack_6b0 + 0x118),(uv_tty_t *)auStack_6b0,uVar1,1);
      auStack_8e0._0_8_ = SEXT48(iVar2);
      if (auStack_7c8._0_8_ != auStack_8e0._0_8_) goto LAB_001d560f;
      pcStack_8f8 = (code *)0x1d5159;
      iVar2 = close(uVar1);
      auStack_7c8._0_8_ = SEXT48(iVar2);
      auStack_8e0._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_7c8._0_8_ != (uv__queue *)0x0) goto LAB_001d5621;
      auStack_7c8._0_8_ = (uv__queue *)0xffffffffffffffea;
      pcStack_8f8 = (code *)0x1d51a7;
      iVar2 = uv_tty_init((uv_loop_t *)(auStack_6b0 + 0x118),(uv_tty_t *)auStack_6b0,uVar1,1);
      auStack_8e0._0_8_ = SEXT48(iVar2);
      if (auStack_7c8._0_8_ == auStack_8e0._0_8_) goto LAB_001d51c1;
      goto LAB_001d5645;
    }
LAB_001d51c1:
    pcStack_8f8 = (code *)0x1d51d1;
    uVar1 = open64("/dev/random",0);
    if (uVar1 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar1;
      auStack_7c8._0_8_ = (uv__queue *)0xffffffffffffffea;
      pcStack_8f8 = (code *)0x1d5200;
      iVar2 = uv_tty_init((uv_loop_t *)(auStack_6b0 + 0x118),(uv_tty_t *)auStack_6b0,uVar1,1);
      auStack_8e0._0_8_ = SEXT48(iVar2);
      if (auStack_7c8._0_8_ != auStack_8e0._0_8_) goto LAB_001d5633;
      pcStack_8f8 = (code *)0x1d5221;
      iVar2 = close(uVar1);
      auStack_7c8._0_8_ = SEXT48(iVar2);
      auStack_8e0._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_7c8._0_8_ == (uv__queue *)0x0) goto LAB_001d5247;
      goto LAB_001d5657;
    }
LAB_001d5247:
    pcStack_8f8 = (code *)0x1d5257;
    uVar1 = open64("/dev/zero",0);
    if (uVar1 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar1;
      auStack_7c8._0_8_ = (uv__queue *)0xffffffffffffffea;
      pcStack_8f8 = (code *)0x1d5286;
      iVar2 = uv_tty_init((uv_loop_t *)(auStack_6b0 + 0x118),(uv_tty_t *)auStack_6b0,uVar1,1);
      auStack_8e0._0_8_ = SEXT48(iVar2);
      if (auStack_7c8._0_8_ != auStack_8e0._0_8_) goto LAB_001d5669;
      pcStack_8f8 = (code *)0x1d52a7;
      iVar2 = close(uVar1);
      auStack_7c8._0_8_ = SEXT48(iVar2);
      auStack_8e0._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_7c8._0_8_ == (uv__queue *)0x0) goto LAB_001d52cd;
      goto LAB_001d567b;
    }
LAB_001d52cd:
    pcStack_8f8 = (code *)0x1d52e0;
    uVar1 = open64("/dev/tty",2);
    if (uVar1 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar1;
      pcStack_8f8 = (code *)0x1d5307;
      iVar2 = uv_tty_init((uv_loop_t *)(auStack_6b0 + 0x118),(uv_tty_t *)auStack_6b0,uVar1,1);
      auStack_7c8._0_8_ = SEXT48(iVar2);
      auStack_8e0._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_7c8._0_8_ != (uv__queue *)0x0) goto LAB_001d568d;
      pcStack_8f8 = (code *)0x1d5334;
      iVar2 = close(uVar1);
      auStack_7c8._0_8_ = SEXT48(iVar2);
      auStack_8e0._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_7c8._0_8_ != (uv__queue *)0x0) goto LAB_001d569f;
      pcStack_8f8 = (code *)0x1d5367;
      iVar2 = uv_is_readable((uv_stream_t *)auStack_6b0);
      if (iVar2 == 0) goto LAB_001d56b1;
      pcStack_8f8 = (code *)0x1d537c;
      iVar2 = uv_is_writable((uv_stream_t *)auStack_6b0);
      if (iVar2 == 0) goto LAB_001d56b6;
      loop = (uv_loop_t *)auStack_6b0;
      pcStack_8f8 = (code *)0x1d5396;
      uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
      pcStack_8f8 = (code *)0x1d539e;
      iVar2 = uv_is_readable((uv_stream_t *)loop);
      if (iVar2 != 0) goto LAB_001d56c8;
      pcStack_8f8 = (code *)0x1d53b3;
      iVar2 = uv_is_writable((uv_stream_t *)auStack_6b0);
      if (iVar2 == 0) goto LAB_001d53bb;
      goto LAB_001d56da;
    }
LAB_001d53bb:
    pcStack_8f8 = (code *)0x1d53cb;
    uVar1 = open64("/dev/tty",0);
    if (uVar1 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar1;
      pcStack_8f8 = (code *)0x1d53f2;
      iVar2 = uv_tty_init((uv_loop_t *)(auStack_6b0 + 0x118),(uv_tty_t *)auStack_7c8,uVar1,1);
      auStack_8e0._0_8_ = SEXT48(iVar2);
      lStack_8f0 = 0;
      if ((uv__queue *)auStack_8e0._0_8_ != (uv__queue *)0x0) goto LAB_001d56bb;
      pcStack_8f8 = (code *)0x1d5417;
      iVar2 = close(uVar1);
      auStack_8e0._0_8_ = SEXT48(iVar2);
      lStack_8f0 = 0;
      if ((uv__queue *)auStack_8e0._0_8_ != (uv__queue *)0x0) goto LAB_001d56cd;
      pcStack_8f8 = (code *)0x1d5442;
      iVar2 = uv_is_readable((uv_stream_t *)auStack_7c8);
      if (iVar2 == 0) goto LAB_001d56df;
      pcStack_8f8 = (code *)0x1d5457;
      iVar2 = uv_is_writable((uv_stream_t *)auStack_7c8);
      if (iVar2 != 0) goto LAB_001d56e4;
      loop = (uv_loop_t *)auStack_7c8;
      pcStack_8f8 = (code *)0x1d5471;
      uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
      pcStack_8f8 = (code *)0x1d5479;
      iVar2 = uv_is_readable((uv_stream_t *)loop);
      if (iVar2 != 0) goto LAB_001d56f6;
      pcStack_8f8 = (code *)0x1d548e;
      iVar2 = uv_is_writable((uv_stream_t *)auStack_7c8);
      if (iVar2 == 0) goto LAB_001d5496;
      goto LAB_001d5708;
    }
LAB_001d5496:
    pcStack_8f8 = (code *)0x1d54a9;
    uVar1 = open64("/dev/tty",1);
    if (uVar1 == 0xffffffff) {
LAB_001d5562:
      pcStack_8f8 = (code *)0x1d5571;
      iVar2 = uv_run((uv_loop_t *)(auStack_6b0 + 0x118),UV_RUN_DEFAULT);
      lStack_8f0 = (long)iVar2;
      lStack_8e8 = 0;
      if (lStack_8f0 != 0) goto LAB_001d55f5;
      loop = (uv_loop_t *)(auStack_6b0 + 0x118);
      pcStack_8f8 = (code *)0x1d55a4;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      pcStack_8f8 = (code *)0x1d55ae;
      uv_run(loop,UV_RUN_DEFAULT);
      lStack_8f0 = 0;
      pcStack_8f8 = (code *)0x1d55be;
      iVar2 = uv_loop_close(loop);
      lStack_8e8 = (long)iVar2;
      if (lStack_8f0 == lStack_8e8) {
        pcStack_8f8 = (code *)0x1d55d5;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d5602;
    }
    loop = (uv_loop_t *)(ulong)uVar1;
    pcStack_8f8 = (code *)0x1d54ca;
    iVar2 = uv_tty_init((uv_loop_t *)(auStack_6b0 + 0x118),(uv_tty_t *)auStack_8e0,uVar1,0);
    lStack_8f0 = (long)iVar2;
    lStack_8e8 = 0;
    if (lStack_8f0 != 0) goto LAB_001d56e9;
    pcStack_8f8 = (code *)0x1d54ef;
    iVar2 = close(uVar1);
    lStack_8f0 = (long)iVar2;
    lStack_8e8 = 0;
    if (lStack_8f0 != 0) goto LAB_001d56fb;
    pcStack_8f8 = (code *)0x1d5517;
    iVar2 = uv_is_readable((uv_stream_t *)auStack_8e0);
    if (iVar2 != 0) goto LAB_001d570d;
    pcStack_8f8 = (code *)0x1d5529;
    iVar2 = uv_is_writable((uv_stream_t *)auStack_8e0);
    if (iVar2 == 0) goto LAB_001d5712;
    loop = (uv_loop_t *)auStack_8e0;
    pcStack_8f8 = (code *)0x1d5540;
    uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
    pcStack_8f8 = (code *)0x1d5548;
    iVar2 = uv_is_readable((uv_stream_t *)loop);
    if (iVar2 != 0) goto LAB_001d5717;
    pcStack_8f8 = (code *)0x1d555a;
    iVar2 = uv_is_writable((uv_stream_t *)auStack_8e0);
    if (iVar2 == 0) goto LAB_001d5562;
  }
  else {
    pcStack_8f8 = (code *)0x1d55f5;
    run_test_tty_file_cold_1();
LAB_001d55f5:
    pcStack_8f8 = (code *)0x1d5602;
    run_test_tty_file_cold_27();
LAB_001d5602:
    pcStack_8f8 = (code *)0x1d560f;
    run_test_tty_file_cold_28();
LAB_001d560f:
    pcStack_8f8 = (code *)0x1d5621;
    run_test_tty_file_cold_2();
LAB_001d5621:
    pcStack_8f8 = (code *)0x1d5633;
    run_test_tty_file_cold_3();
LAB_001d5633:
    pcStack_8f8 = (code *)0x1d5645;
    run_test_tty_file_cold_5();
LAB_001d5645:
    pcStack_8f8 = (code *)0x1d5657;
    run_test_tty_file_cold_4();
LAB_001d5657:
    pcStack_8f8 = (code *)0x1d5669;
    run_test_tty_file_cold_6();
LAB_001d5669:
    pcStack_8f8 = (code *)0x1d567b;
    run_test_tty_file_cold_7();
LAB_001d567b:
    pcStack_8f8 = (code *)0x1d568d;
    run_test_tty_file_cold_8();
LAB_001d568d:
    pcStack_8f8 = (code *)0x1d569f;
    run_test_tty_file_cold_9();
LAB_001d569f:
    pcStack_8f8 = (code *)0x1d56b1;
    run_test_tty_file_cold_10();
LAB_001d56b1:
    pcStack_8f8 = (code *)0x1d56b6;
    run_test_tty_file_cold_14();
LAB_001d56b6:
    pcStack_8f8 = (code *)0x1d56bb;
    run_test_tty_file_cold_13();
LAB_001d56bb:
    pcStack_8f8 = (code *)0x1d56c8;
    run_test_tty_file_cold_15();
LAB_001d56c8:
    pcStack_8f8 = (code *)0x1d56cd;
    run_test_tty_file_cold_11();
LAB_001d56cd:
    pcStack_8f8 = (code *)0x1d56da;
    run_test_tty_file_cold_16();
LAB_001d56da:
    pcStack_8f8 = (code *)0x1d56df;
    run_test_tty_file_cold_12();
LAB_001d56df:
    pcStack_8f8 = (code *)0x1d56e4;
    run_test_tty_file_cold_20();
LAB_001d56e4:
    pcStack_8f8 = (code *)0x1d56e9;
    run_test_tty_file_cold_17();
LAB_001d56e9:
    pcStack_8f8 = (code *)0x1d56f6;
    run_test_tty_file_cold_21();
LAB_001d56f6:
    pcStack_8f8 = (code *)0x1d56fb;
    run_test_tty_file_cold_18();
LAB_001d56fb:
    pcStack_8f8 = (code *)0x1d5708;
    run_test_tty_file_cold_22();
LAB_001d5708:
    pcStack_8f8 = (code *)0x1d570d;
    run_test_tty_file_cold_19();
LAB_001d570d:
    pcStack_8f8 = (code *)0x1d5712;
    run_test_tty_file_cold_23();
LAB_001d5712:
    pcStack_8f8 = (code *)0x1d5717;
    run_test_tty_file_cold_26();
LAB_001d5717:
    pcStack_8f8 = (code *)0x1d571c;
    run_test_tty_file_cold_24();
  }
  pcStack_8f8 = run_test_tty_pty;
  run_test_tty_file_cold_25();
  handle = (uv_handle_t *)auStack_e78;
  puStack_900 = loop;
  pcStack_8f8 = (code *)piVar5;
  iVar2 = uv_loop_init(&uStack_c28);
  uStack_e58.data = (void *)(long)iVar2;
  uStack_d40.data = (void *)0x0;
  if ((uv__queue *)uStack_e58.data == (uv__queue *)0x0) {
    iVar2 = openpty(auStack_e78 + 0x14,auStack_e78 + 0x10,0,0,auStack_e78 + 0x18);
    if (iVar2 != 0) {
      run_test_tty_pty_cold_2();
      return 7;
    }
    iVar2 = uv_tty_init(&uStack_c28,&uStack_d40,auStack_e78._16_4_,0);
    uStack_e58.data = (void *)(long)iVar2;
    auStack_e78._0_8_ = (uv_loop_t *)0x0;
    if ((uv__queue *)uStack_e58.data != (uv__queue *)0x0) goto LAB_001d597f;
    iVar2 = uv_tty_init(&uStack_c28,(uv_tty_t *)(auStack_e78 + 0x20),auStack_e78._20_4_,0);
    auStack_e78._0_8_ = SEXT48(iVar2);
    auStack_e78._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_e78._0_8_ != (uv_loop_t *)0x0) goto LAB_001d598c;
    iVar2 = uv_is_readable((uv_stream_t *)&uStack_d40);
    if (iVar2 == 0) goto LAB_001d5999;
    iVar2 = uv_is_writable((uv_stream_t *)&uStack_d40);
    if (iVar2 == 0) goto LAB_001d599e;
    iVar2 = uv_is_readable((uv_stream_t *)(auStack_e78 + 0x20));
    if (iVar2 == 0) goto LAB_001d59a3;
    iVar2 = uv_is_writable((uv_stream_t *)(auStack_e78 + 0x20));
    if (iVar2 == 0) goto LAB_001d59a8;
    auStack_e78._0_8_ = ZEXT48(uStack_d40.flags & 0x100000);
    auStack_e78._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_e78._0_8_ != (uv_loop_t *)0x0) goto LAB_001d59ad;
    if ((uStack_e58.flags._2_1_ & 0x10) == 0) goto LAB_001d59ba;
    iVar2 = close(auStack_e78._16_4_);
    auStack_e78._0_8_ = SEXT48(iVar2);
    auStack_e78._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_e78._0_8_ != (uv_loop_t *)0x0) goto LAB_001d59bf;
    uv_close((uv_handle_t *)&uStack_d40,(uv_close_cb)0x0);
    iVar2 = close(auStack_e78._20_4_);
    auStack_e78._0_8_ = SEXT48(iVar2);
    auStack_e78._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_e78._0_8_ != (uv_loop_t *)0x0) goto LAB_001d59cc;
    uv_close((uv_handle_t *)(auStack_e78 + 0x20),(uv_close_cb)0x0);
    iVar2 = uv_run(&uStack_c28,UV_RUN_DEFAULT);
    auStack_e78._0_8_ = SEXT48(iVar2);
    auStack_e78._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_e78._0_8_ == (uv_loop_t *)0x0) {
      uv_walk(&uStack_c28,close_walk_cb,(void *)0x0);
      uv_run(&uStack_c28,UV_RUN_DEFAULT);
      auStack_e78._0_8_ = (uv_loop_t *)0x0;
      iVar2 = uv_loop_close(&uStack_c28);
      auStack_e78._8_8_ = SEXT48(iVar2);
      if (auStack_e78._0_8_ == auStack_e78._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d59e6;
    }
  }
  else {
    run_test_tty_pty_cold_1();
LAB_001d597f:
    run_test_tty_pty_cold_3();
LAB_001d598c:
    run_test_tty_pty_cold_4();
LAB_001d5999:
    run_test_tty_pty_cold_14();
LAB_001d599e:
    run_test_tty_pty_cold_13();
LAB_001d59a3:
    run_test_tty_pty_cold_12();
LAB_001d59a8:
    run_test_tty_pty_cold_11();
LAB_001d59ad:
    run_test_tty_pty_cold_5();
LAB_001d59ba:
    run_test_tty_pty_cold_10();
LAB_001d59bf:
    run_test_tty_pty_cold_6();
LAB_001d59cc:
    run_test_tty_pty_cold_7();
  }
  run_test_tty_pty_cold_8();
LAB_001d59e6:
  run_test_tty_pty_cold_9();
  iVar2 = uv_is_closing(handle);
  if (iVar2 != 0) {
    return iVar2;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tty) {
  int r, width, height;
  uv_os_fd_t ttyin_fd, ttyout_fd;
  uv_tty_t tty_in, tty_out;
  uv_loop_t* loop = uv_default_loop();

  /* Make sure we have an FD that refers to a tty */
#ifdef _WIN32
  ttyin_fd = CreateFileA("conin$",
                         GENERIC_READ | GENERIC_WRITE,
                         FILE_SHARE_READ | FILE_SHARE_WRITE,
                         NULL,
                         OPEN_EXISTING,
                         FILE_ATTRIBUTE_NORMAL,
                         NULL);
  ASSERT_PTR_NE(ttyin_fd, INVALID_HANDLE_VALUE);

  ttyout_fd = CreateFileA("conout$",
                          GENERIC_READ | GENERIC_WRITE,
                          FILE_SHARE_READ | FILE_SHARE_WRITE,
                          NULL,
                          OPEN_EXISTING,
                          FILE_ATTRIBUTE_NORMAL,
                          NULL);
  ASSERT_PTR_NE(ttyout_fd, INVALID_HANDLE_VALUE);

#else /* unix */
  ttyin_fd = open("/dev/tty", O_RDONLY, 0);
  if (ttyin_fd < 0) {
    fprintf(stderr, "Cannot open /dev/tty as read-only: %s\n", strerror(errno));
    fflush(stderr);
    return TEST_SKIP;
  }

  ttyout_fd = open("/dev/tty", O_WRONLY, 0);
  if (ttyout_fd < 0) {
    fprintf(stderr, "Cannot open /dev/tty as write-only: %s\n", strerror(errno));
    fflush(stderr);
    return TEST_SKIP;
  }

  ASSERT_GE(ttyin_fd, 0);
  ASSERT_GE(ttyout_fd, 0);
#endif

  ASSERT_EQ(UV_UNKNOWN_HANDLE, uv_guess_handle((uv_os_fd_t) -1));

  ASSERT_EQ(UV_TTY, uv_guess_handle(ttyin_fd));
  ASSERT_EQ(UV_TTY, uv_guess_handle(ttyout_fd));

  r = uv_tty_init(loop, &tty_in, ttyin_fd, 1);  /* Readable. */
  ASSERT_OK(r);
  ASSERT(uv_is_readable((uv_stream_t*) &tty_in));
  ASSERT(!uv_is_writable((uv_stream_t*) &tty_in));

  r = uv_tty_init(loop, &tty_out, ttyout_fd, 0);  /* Writable. */
  ASSERT_OK(r);
  ASSERT(!uv_is_readable((uv_stream_t*) &tty_out));
  ASSERT(uv_is_writable((uv_stream_t*) &tty_out));

  r = uv_tty_get_winsize(&tty_out, &width, &height);
  ASSERT_OK(r);

  printf("width=%d height=%d\n", width, height);

  if (width == 0 && height == 0) {
   /* Some environments such as containers or Jenkins behave like this
    * sometimes */
    MAKE_VALGRIND_HAPPY(loop);
    return TEST_SKIP;
  }

  ASSERT_GT(width, 0);
  ASSERT_GT(height, 0);

  /* Turn on raw mode. */
  r = uv_tty_set_mode(&tty_in, UV_TTY_MODE_RAW);
  ASSERT_OK(r);

  /* Turn off raw mode. */
  r = uv_tty_set_mode(&tty_in, UV_TTY_MODE_NORMAL);
  ASSERT_OK(r);

  /* Calling uv_tty_reset_mode() repeatedly should not clobber errno. */
  errno = 0;
  ASSERT_OK(uv_tty_reset_mode());
  ASSERT_OK(uv_tty_reset_mode());
  ASSERT_OK(uv_tty_reset_mode());
  ASSERT_OK(errno);

  /* TODO check the actual mode! */

  uv_close((uv_handle_t*) &tty_in, NULL);
  uv_close((uv_handle_t*) &tty_out, NULL);

  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}